

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSnapObjects.cpp
# Opt level: O3

RecyclableObject *
TTD::NSSnapObjects::DoObjectInflation_SnapTypedArrayInfo(SnapObject *snpObject,InflateMap *inflator)

{
  uint32 *puVar1;
  JavascriptLibrary *javascriptLibrary;
  ScriptContext *pSVar2;
  RecyclableObject *pRVar3;
  ArrayBuffer *arrayBuffer;
  Var aValue;
  
  pSVar2 = InflateMap::LookupScriptContext(inflator,snpObject->SnapType->ScriptContextLogId);
  if (snpObject->SnapObjectTag == SnapTypedArrayObject) {
    puVar1 = (uint32 *)snpObject->AddtlSnapObjectInfo;
    javascriptLibrary = (pSVar2->super_ScriptContextBase).javascriptLibrary;
    pRVar3 = InflateMap::LookupObject(inflator,*(TTD_PTR_ID *)(puVar1 + 2));
    arrayBuffer = Js::VarTo<Js::ArrayBuffer,Js::RecyclableObject>(pRVar3);
    switch(snpObject->SnapType->JsTypeId) {
    case TypeIds_Int8Array:
      aValue = Js::TypedArray<char,_false,_false>::Create
                         (&arrayBuffer->super_ArrayBufferBase,*puVar1,puVar1[1],javascriptLibrary);
      break;
    case TypeIds_Uint8Array:
      aValue = Js::TypedArray<unsigned_char,_false,_false>::Create
                         (&arrayBuffer->super_ArrayBufferBase,*puVar1,puVar1[1],javascriptLibrary);
      break;
    case TypeIds_Uint8ClampedArray:
      aValue = Js::TypedArray<unsigned_char,_true,_false>::Create
                         (&arrayBuffer->super_ArrayBufferBase,*puVar1,puVar1[1],javascriptLibrary);
      break;
    case TypeIds_Int16Array:
      aValue = Js::TypedArray<short,_false,_false>::Create
                         (&arrayBuffer->super_ArrayBufferBase,*puVar1,puVar1[1],javascriptLibrary);
      break;
    case TypeIds_Uint16Array:
      aValue = Js::TypedArray<unsigned_short,_false,_false>::Create
                         (&arrayBuffer->super_ArrayBufferBase,*puVar1,puVar1[1],javascriptLibrary);
      break;
    case TypeIds_Int32Array:
      aValue = Js::TypedArray<int,_false,_false>::Create
                         (&arrayBuffer->super_ArrayBufferBase,*puVar1,puVar1[1],javascriptLibrary);
      break;
    case TypeIds_Uint32Array:
      aValue = Js::TypedArray<unsigned_int,_false,_false>::Create
                         (&arrayBuffer->super_ArrayBufferBase,*puVar1,puVar1[1],javascriptLibrary);
      break;
    case TypeIds_Float32Array:
      aValue = Js::TypedArray<float,_false,_false>::Create
                         (&arrayBuffer->super_ArrayBufferBase,*puVar1,puVar1[1],javascriptLibrary);
      break;
    case TypeIds_Float64Array:
      aValue = Js::TypedArray<double,_false,_false>::Create
                         (&arrayBuffer->super_ArrayBufferBase,*puVar1,puVar1[1],javascriptLibrary);
      break;
    case TypeIds_Int64Array:
      aValue = Js::TypedArray<long,_false,_false>::Create
                         (&arrayBuffer->super_ArrayBufferBase,*puVar1,puVar1[1],javascriptLibrary);
      break;
    case TypeIds_Uint64Array:
      aValue = Js::TypedArray<unsigned_long,_false,_false>::Create
                         (&arrayBuffer->super_ArrayBufferBase,*puVar1,puVar1[1],javascriptLibrary);
      break;
    case TypeIds_CharArray:
      aValue = Js::CharArray::Create
                         (&arrayBuffer->super_ArrayBufferBase,*puVar1,puVar1[1],javascriptLibrary);
      break;
    case TypeIds_BoolArray:
      aValue = Js::TypedArray<bool,_false,_false>::Create
                         (&arrayBuffer->super_ArrayBufferBase,*puVar1,puVar1[1],javascriptLibrary);
      break;
    default:
      TTDAbort_unrecoverable_error("Not a typed array!");
    }
    pRVar3 = Js::VarTo<Js::RecyclableObject>(aValue);
    return pRVar3;
  }
  TTDAbort_unrecoverable_error("Tag does not match.");
}

Assistant:

Js::RecyclableObject* DoObjectInflation_SnapTypedArrayInfo(const SnapObject* snpObject, InflateMap* inflator)
        {
            //I am lazy and always re-create typed arrays.
            //We can re-evaluate this choice later if needed.

            Js::ScriptContext* ctx = inflator->LookupScriptContext(snpObject->SnapType->ScriptContextLogId);
            SnapTypedArrayInfo* typedArrayInfo = SnapObjectGetAddtlInfoAs<SnapTypedArrayInfo*, SnapObjectType::SnapTypedArrayObject>(snpObject);

            Js::JavascriptLibrary* jslib = ctx->GetLibrary();
            Js::ArrayBuffer* arrayBuffer = Js::VarTo<Js::ArrayBuffer>(inflator->LookupObject(typedArrayInfo->ArrayBufferAddr));

            Js::Var tab = nullptr;
            switch(snpObject->SnapType->JsTypeId)
            {
            case Js::TypeIds_Int8Array:
                tab = Js::Int8Array::Create(arrayBuffer, typedArrayInfo->ByteOffset, typedArrayInfo->Length, jslib);
                break;
            case Js::TypeIds_Uint8Array:
                tab = Js::Uint8Array::Create(arrayBuffer, typedArrayInfo->ByteOffset, typedArrayInfo->Length, jslib);
                break;
            case Js::TypeIds_Uint8ClampedArray:
                tab = Js::Uint8ClampedArray::Create(arrayBuffer, typedArrayInfo->ByteOffset, typedArrayInfo->Length, jslib);
                break;
            case Js::TypeIds_Int16Array:
                tab = Js::Int16Array::Create(arrayBuffer, typedArrayInfo->ByteOffset, typedArrayInfo->Length, jslib);
                break;
            case Js::TypeIds_Uint16Array:
                tab = Js::Uint16Array::Create(arrayBuffer, typedArrayInfo->ByteOffset, typedArrayInfo->Length, jslib);
                break;
            case Js::TypeIds_Int32Array:
                tab = Js::Int32Array::Create(arrayBuffer, typedArrayInfo->ByteOffset, typedArrayInfo->Length, jslib);
                break;
            case Js::TypeIds_Uint32Array:
                tab = Js::Uint32Array::Create(arrayBuffer, typedArrayInfo->ByteOffset, typedArrayInfo->Length, jslib);
                break;
            case Js::TypeIds_Float32Array:
                tab = Js::Float32Array::Create(arrayBuffer, typedArrayInfo->ByteOffset, typedArrayInfo->Length, jslib);
                break;
            case Js::TypeIds_Float64Array:
                tab = Js::Float64Array::Create(arrayBuffer, typedArrayInfo->ByteOffset, typedArrayInfo->Length, jslib);
                break;
            case Js::TypeIds_Int64Array:
                tab = Js::Int64Array::Create(arrayBuffer, typedArrayInfo->ByteOffset, typedArrayInfo->Length, jslib);
                break;
            case Js::TypeIds_Uint64Array:
                tab = Js::Uint64Array::Create(arrayBuffer, typedArrayInfo->ByteOffset, typedArrayInfo->Length, jslib);
                break;
            case Js::TypeIds_BoolArray:
                tab = Js::BoolArray::Create(arrayBuffer, typedArrayInfo->ByteOffset, typedArrayInfo->Length, jslib);
                break;
            case Js::TypeIds_CharArray:
                tab = Js::CharArray::Create(arrayBuffer, typedArrayInfo->ByteOffset, typedArrayInfo->Length, jslib);
                break;
            default:
                TTDAssert(false, "Not a typed array!");
                break;
            }

            return Js::VarTo<Js::RecyclableObject>(tab);
        }